

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::mergeQualifiers
          (TParseContext *this,TSourceLoc *loc,TQualifier *dst,TQualifier *src,bool force)

{
  pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *ppVar1;
  pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_> *__v;
  undefined8 uVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  TSpirvDecorate *pTVar10;
  TSpirvDecorate *this_00;
  _Rb_tree_header *p_Var11;
  iterator iVar12;
  _Base_ptr p_Var13;
  iterator iVar14;
  uint uVar15;
  uint uVar16;
  char *pcVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  byte bVar25;
  ushort uVar26;
  TPrecisionQualifier p;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  TStorageQualifier TVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  TMap<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>_> *__range3;
  TParseContext *this_01;
  
  uVar9 = *(ulong *)&src->field_0x8;
  this_01 = this;
  if (((uVar9 & 0x318020000000) != 0) && ((*(ulong *)&dst->field_0x8 & 0x318020000000) != 0)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only have one auxiliary qualifier (centroid, patch, and sample)","","")
    ;
    uVar9 = *(ulong *)&src->field_0x8;
  }
  if (((uVar9 & 0x60c0000000) != 0) && ((*(ulong *)&dst->field_0x8 & 0x60c0000000) != 0)) {
    this_01 = this;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "can only have one interpolation qualifier (flat, smooth, noperspective, __explicitInterpAMD)"
               ,"","");
  }
  if (!force) {
    iVar8 = 0x1a4;
    if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
      iVar8 = 0x136;
    }
    if (((this->super_TParseContextBase).super_TParseVersions.version < iVar8) &&
       (this_01 = this,
       iVar8 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                         (this,"GL_ARB_shading_language_420pack"), (char)iVar8 == '\0')) {
      uVar9 = *(ulong *)&src->field_0x8;
      if (((uVar9 & 0x1000000000) != 0) && ((*(ulong *)&dst->field_0x8 & 0x31e0fe00007f) != 0)) {
        this_01 = this;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"precise qualifier must appear first","","");
        uVar9 = *(ulong *)&src->field_0x8;
      }
      if ((((uint)uVar9 >> 0x1c & 1) == 0) || ((*(ulong *)&dst->field_0x8 & 0x31e0ee00007f) == 0)) {
        if (((uVar9 & 0x60c0000000) != 0) && ((*(ulong *)&dst->field_0x8 & 0x31802e00007f) != 0)) {
          pcVar17 = "interpolation qualifiers must appear before storage and precision qualifiers";
          goto LAB_0041953b;
        }
        if (((uVar9 & 0x318020000000) != 0) && ((*(uint *)&dst->field_0x8 & 0xe00007f) != 0)) {
          pcVar17 = 
          "Auxiliary qualifiers (centroid, patch, and sample) must appear before storage and precision qualifiers"
          ;
          goto LAB_0041953b;
        }
        if (((uVar9 & 0x7f) != 0) && ((dst->field_0xb & 0xe) != 0)) {
          pcVar17 = "precision qualifier must appear as last qualifier";
          goto LAB_0041953b;
        }
      }
      else {
        pcVar17 = 
        "invariant qualifier must appear before interpolation, storage, and precision qualifiers ";
LAB_0041953b:
        this_01 = this;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,pcVar17,"","");
      }
      uVar9 = *(ulong *)&src->field_0x8;
      if ((((uVar9 & 0x1000000000) != 0) && ((*(uint *)&dst->field_0x8 & 0x7f) < 0x12)) &&
         ((0x30004U >> (*(uint *)&dst->field_0x8 & 0x1f) & 1) != 0)) {
        this_01 = this;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"precise qualifier must appear first","","");
        uVar9 = *(ulong *)&src->field_0x8;
      }
      if ((((uint)uVar9 & 0x7f) == 2) && ((*(uint *)&dst->field_0x8 & 0x7e) == 0x10)) {
        this_01 = this;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"in/out must appear before const","","");
      }
    }
  }
  uVar9 = *(ulong *)&dst->field_0x8;
  uVar15 = (uint)uVar9 & 0x7f;
  if (uVar15 < 2) {
    uVar9 = uVar9 & 0xffffffffffffff80 | (ulong)((uint)*(undefined8 *)&src->field_0x8 & 0x7f);
LAB_0041966a:
    *(ulong *)&dst->field_0x8 = uVar9;
  }
  else {
    if ((uVar15 == 0x10) && ((*(uint *)&src->field_0x8 & 0x7f) == 0x11)) {
LAB_0041964a:
      uVar9 = uVar9 & 0xffffffffffffff80 | 0x12;
      goto LAB_0041966a;
    }
    uVar15 = (uint)uVar9 & 0x7f;
    this_01 = *(TParseContext **)&src->field_0x8;
    TVar31 = (TStorageQualifier)this_01;
    if (uVar15 == 2) {
      if ((TVar31 & 0x7f) == EvqIn) {
LAB_00419662:
        uVar9 = uVar9 & 0xffffffffffffff80 | 0x13;
        goto LAB_0041966a;
      }
    }
    else if (uVar15 == 0x10) {
      if ((TVar31 & 0x7f) == EvqConst) goto LAB_00419662;
    }
    else if ((uVar15 == 0x11) && ((TVar31 & 0x7f) == EvqIn)) goto LAB_0041964a;
    TVar31 = TVar31 & 0x7f;
    this_01 = (TParseContext *)(ulong)TVar31;
    if (EvqGlobal < TVar31) {
      pcVar17 = GetStorageQualifierString(TVar31);
      this_01 = this;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"too many storage qualifiers",pcVar17,"");
    }
  }
  if (force) {
    uVar9 = *(ulong *)&dst->field_0x8;
    if (((uVar9 & 0xe000000) != 0) && ((src->field_0xb & 0xe) == 0)) goto LAB_004197ee;
LAB_004196fd:
    uVar9 = uVar9 & 0xfffffffff1ffffff | (ulong)((uint)*(undefined8 *)&src->field_0x8 & 0xe000000);
    *(ulong *)&dst->field_0x8 = uVar9;
    if (force) goto LAB_004197ee;
  }
  else {
    p = *(uint *)&src->field_0x8 >> 0x19 & 7;
    this_01 = (TParseContext *)(ulong)p;
    uVar9 = *(ulong *)&dst->field_0x8;
    if ((uVar9 & 0xe000000) != 0 && p != EpqNone) {
      pcVar17 = GetPrecisionQualifierString(p);
      this_01 = this;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"only one precision qualifier allowed",pcVar17,"");
      uVar9 = *(ulong *)&dst->field_0x8;
    }
    if ((uVar9 & 0xe000000) == 0) goto LAB_004196fd;
  }
  this_01 = *(TParseContext **)&src->field_0x8;
  if ((((((((ulong)this_01 & 0x2000000000000) != 0) && ((uVar9 & 0x1f0000000000000) != 0)) ||
        ((((ulong)this_01 & 0x10000000000000) != 0 && ((uVar9 & 0x1e2000000000000) != 0)))) ||
       ((((ulong)this_01 & 0x20000000000000) != 0 && ((uVar9 & 0x1d2000000000000) != 0)))) ||
      ((((ulong)this_01 & 0x40000000000000) != 0 && ((uVar9 & 0x1b2000000000000) != 0)))) ||
     (((((ulong)this_01 & 0x80000000000000) != 0 && ((uVar9 & 0x172000000000000) != 0)) ||
      ((((ulong)this_01 & 0x100000000000000) != 0 && ((uVar9 & 0xf2000000000000) != 0)))))) {
    pcVar17 = GetPrecisionQualifierString((TPrecisionQualifier)((ulong)this_01 >> 0x19) & 7);
    this_01 = this;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "only one coherent/devicecoherent/queuefamilycoherent/workgroupcoherent/subgroupcoherent/shadercallcoherent qualifier allowed"
               ,pcVar17,"");
  }
LAB_004197ee:
  uVar23 = 0;
  mergeObjectLayoutQualifiers(this_01,dst,src,false);
  uVar9 = *(ulong *)&dst->field_0x8;
  uVar19 = (uint)(*(ulong *)&src->field_0x8 >> 0x1c) & 1;
  uVar15 = (uint)uVar9;
  if ((uVar15 >> 0x1c & 1) == 0) {
    uVar19 = 0;
  }
  uVar18 = (uint)*(ulong *)&src->field_0x8 & 0x10000000 | uVar9;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar16 = (uint)(*(ulong *)&src->field_0x8 >> 0x1d) & 1;
  if ((uVar15 >> 0x1d & 1) == 0) {
    uVar16 = 0;
  }
  uVar18 = (uint)*(ulong *)&src->field_0x8 & 0x20000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar3 = (uint)(*(ulong *)&src->field_0x8 >> 0x1e) & 1;
  if ((uVar15 >> 0x1e & 1) == 0) {
    uVar3 = uVar23;
  }
  uVar18 = (uint)*(ulong *)&src->field_0x8 & 0x40000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar2 = *(undefined8 *)&src->field_0x8;
  uVar18 = (uint)uVar2 & 0x80000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar32 = (uint)(*(ulong *)&src->field_0x8 >> 0x20) & 1;
  if ((uVar9 >> 0x20 & 1) == 0) {
    uVar32 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x100000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar4 = (uint)(*(ulong *)&src->field_0x8 >> 0x24) & 1;
  if ((uVar9 & 0x1000000000) == 0) {
    uVar4 = uVar23;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x1000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar27 = (uint)(*(ulong *)&src->field_0x8 >> 0x25) & 1;
  if ((uVar9 >> 0x25 & 1) == 0) {
    uVar27 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x2000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar20 = (uint)(*(ulong *)&src->field_0x8 >> 0x26) & 1;
  if ((uVar9 >> 0x26 & 1) == 0) {
    uVar20 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x4000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar33 = (uint)(*(ulong *)&src->field_0x8 >> 0x29) & 1;
  if ((uVar9 >> 0x29 & 1) == 0) {
    uVar33 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x20000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar28 = (uint)(*(ulong *)&src->field_0x8 >> 0x2a) & 1;
  if ((uVar9 >> 0x2a & 1) == 0) {
    uVar28 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x40000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar21 = (uint)(*(ulong *)&src->field_0x8 >> 0x2b) & 1;
  if ((uVar9 >> 0x2b & 1) == 0) {
    uVar21 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x80000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar5 = (uint)(*(ulong *)&src->field_0x8 >> 0x2c) & 1;
  if ((uVar9 >> 0x2c & 1) == 0) {
    uVar5 = uVar23;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x100000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar38 = (uint)(*(ulong *)&src->field_0x8 >> 0x2d) & 1;
  if ((uVar9 >> 0x2d & 1) == 0) {
    uVar38 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x200000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar34 = (uint)(*(ulong *)&src->field_0x8 >> 0x31) & 1;
  if ((uVar9 & 0x2000000000000) == 0) {
    uVar34 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x2000000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar29 = (uint)(*(ulong *)&src->field_0x8 >> 0x34) & 1;
  if ((uVar9 & 0x10000000000000) == 0) {
    uVar29 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x10000000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar6 = (uint)(*(ulong *)&src->field_0x8 >> 0x35) & 1;
  if ((uVar9 & 0x20000000000000) == 0) {
    uVar6 = uVar23;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x20000000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar30 = (uint)(*(ulong *)&src->field_0x8 >> 0x36) & 1;
  if ((uVar9 & 0x40000000000000) == 0) {
    uVar30 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x40000000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar35 = (uint)(*(ulong *)&src->field_0x8 >> 0x37) & 1;
  if ((uVar9 & 0x80000000000000) == 0) {
    uVar35 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x80000000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  bVar25 = (byte)(*(ulong *)&src->field_0x8 >> 0x38) & 1;
  if ((uVar9 & 0x100000000000000) == 0) {
    bVar25 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x100000000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar36 = (uint)(*(ulong *)&src->field_0x8 >> 0x39) & 1;
  if ((uVar9 >> 0x39 & 1) == 0) {
    uVar36 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x200000000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar22 = (uint)(*(ulong *)&src->field_0x8 >> 0x32) & 1;
  if ((uVar9 >> 0x32 & 1) == 0) {
    uVar22 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x4000000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar7 = (uint)(*(ulong *)&src->field_0x8 >> 0x33) & 1;
  if ((uVar9 >> 0x33 & 1) == 0) {
    uVar7 = uVar23;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x8000000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar23 = (uint)(*(ulong *)&src->field_0x8 >> 0x2e) & 1;
  if ((uVar9 >> 0x2e & 1) == 0) {
    uVar23 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x400000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar37 = (uint)(*(ulong *)&src->field_0x8 >> 0x2f) & 1;
  if ((uVar9 >> 0x2f & 1) == 0) {
    uVar37 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x800000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar26 = (ushort)(*(ulong *)&src->field_0x8 >> 0x30) & 1;
  if ((uVar9 >> 0x30 & 1) == 0) {
    uVar26 = 0;
  }
  uVar18 = *(ulong *)&src->field_0x8 & 0x1000000000000 | uVar18;
  *(ulong *)&dst->field_0x8 = uVar18;
  uVar24 = (uint)(*(ulong *)&src->field_0x8 >> 0x21) & 1;
  if ((uVar9 >> 0x21 & 1) == 0) {
    uVar24 = 0;
  }
  *(ulong *)&dst->field_0x8 = *(ulong *)&src->field_0x8 & 0x200000000 | uVar18;
  dst->spirvStorageClass = src->spirvStorageClass;
  if (src->spirvDecorate != (TSpirvDecorate *)0x0) {
    if (dst->spirvDecorate == (TSpirvDecorate *)0x0) {
      dst->spirvDecorate = src->spirvDecorate;
    }
    else {
      pTVar10 = TQualifier::getSpirvDecorate(src);
      this_00 = TQualifier::getSpirvDecorate(dst);
      p_Var11 = &(this_00->decorates).
                 super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                 ._M_t._M_impl.super__Rb_tree_header;
      for (p_Var13 = (pTVar10->decorates).
                     super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                     ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var13 !=
          &(pTVar10->decorates).
           super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
           ._M_t._M_impl.super__Rb_tree_header;
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
        ppVar1 = (pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *)
                 (p_Var13 + 1);
        iVar12 = std::
                 _Rb_tree<int,_std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>,_std::_Select1st<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                 ::find((_Rb_tree<int,_std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>,_std::_Select1st<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                         *)this_00,(key_type_conflict1 *)ppVar1);
        if ((_Rb_tree_header *)iVar12._M_node == p_Var11) {
          std::
          _Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>>
          ::
          _M_insert_unique<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>const&>
                    ((_Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>>
                      *)this_00,ppVar1);
        }
        else {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"too many SPIR-V decorate qualifiers","spirv_decorate",
                     "(decoration=%u)",(ulong)(uint)ppVar1->first);
        }
      }
      for (p_Var13 = (pTVar10->decorateIds).
                     super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                     ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var13 !=
          &(pTVar10->decorateIds).
           super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
           ._M_t._M_impl.super__Rb_tree_header;
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
        __v = (pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_> *)(p_Var13 + 1);
        iVar14 = std::
                 _Rb_tree<int,_std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>,_std::_Select1st<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                 ::find((_Rb_tree<int,_std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>,_std::_Select1st<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                         *)&this_00->decorateIds,(key_type_conflict1 *)__v);
        if ((_Rb_tree_header *)iVar14._M_node ==
            &(this_00->decorateIds).
             super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
             ._M_t._M_impl.super__Rb_tree_header) {
          std::
          _Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>>>
          ::
          _M_insert_unique<std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>const&>
                    ((_Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>>>
                      *)&this_00->decorateIds,__v);
        }
        else {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"too many SPIR-V decorate qualifiers","spirv_decorate_id",
                     "(decoration=%u)",(ulong)(uint)__v->first);
        }
      }
      for (p_Var13 = (pTVar10->decorateStrings).
                     super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                     ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var13 !=
          &(pTVar10->decorateStrings).
           super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
           ._M_t._M_impl.super__Rb_tree_header;
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
        ppVar1 = (pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *)
                 (p_Var13 + 1);
        iVar12 = std::
                 _Rb_tree<int,_std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>,_std::_Select1st<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                 ::find((_Rb_tree<int,_std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>,_std::_Select1st<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                         *)this_00,(key_type_conflict1 *)ppVar1);
        if ((_Rb_tree_header *)iVar12._M_node == p_Var11) {
          std::
          _Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>>
          ::
          _M_insert_unique<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>const&>
                    ((_Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>>
                      *)&this_00->decorateStrings,ppVar1);
        }
        else {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"too many SPIR-V decorate qualifiers","spirv_decorate_string",
                     "(decoration=%u)",(ulong)(uint)ppVar1->first);
        }
      }
    }
  }
  if ((uVar24 == 0 && (uVar26 == 0 && (uVar37 == 0 && (uVar23 == 0 && uVar7 == 0)))) &&
      (uVar22 == 0 &&
      ((uVar36 == 0 && (bVar25 == 0 && (uVar35 == 0 && uVar30 == 0))) &&
      (uVar6 == 0 &&
      ((uVar29 == 0 && (uVar34 == 0 && (uVar38 == 0 && uVar5 == 0))) &&
      (uVar21 == 0 &&
      ((uVar28 == 0 && (uVar33 == 0 && (uVar20 == 0 && uVar27 == 0))) &&
      (uVar4 == 0 &&
      (uVar32 == 0 &&
      ((((byte)((ulong)uVar2 >> 0x18) >> 7 & (int)uVar15 < 0) == 0 && uVar3 == 0) &&
      (uVar16 == 0 && uVar19 == 0))))))))))) {
    return;
  }
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  (*UNRECOVERED_JUMPTABLE)(this,loc,"replicated qualifiers","","",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::mergeQualifiers(const TSourceLoc& loc, TQualifier& dst, const TQualifier& src, bool force)
{
    // Multiple auxiliary qualifiers (mostly done later by 'individual qualifiers')
    if (src.isAuxiliary() && dst.isAuxiliary())
        error(loc, "can only have one auxiliary qualifier (centroid, patch, and sample)", "", "");

    // Multiple interpolation qualifiers (mostly done later by 'individual qualifiers')
    if (src.isInterpolation() && dst.isInterpolation())
        error(loc, "can only have one interpolation qualifier (flat, smooth, noperspective, __explicitInterpAMD)", "", "");

    // Ordering
    if (! force && ((!isEsProfile() && version < 420) ||
                    (isEsProfile() && version < 310))
                && ! extensionTurnedOn(E_GL_ARB_shading_language_420pack)) {
        // non-function parameters
        if (src.isNoContraction() && (dst.invariant || dst.isInterpolation() || dst.isAuxiliary() || dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "precise qualifier must appear first", "", "");
        if (src.invariant && (dst.isInterpolation() || dst.isAuxiliary() || dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "invariant qualifier must appear before interpolation, storage, and precision qualifiers ", "", "");
        else if (src.isInterpolation() && (dst.isAuxiliary() || dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "interpolation qualifiers must appear before storage and precision qualifiers", "", "");
        else if (src.isAuxiliary() && (dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "Auxiliary qualifiers (centroid, patch, and sample) must appear before storage and precision qualifiers", "", "");
        else if (src.storage != EvqTemporary && (dst.precision != EpqNone))
            error(loc, "precision qualifier must appear as last qualifier", "", "");

        // function parameters
        if (src.isNoContraction() && (dst.storage == EvqConst || dst.storage == EvqIn || dst.storage == EvqOut))
            error(loc, "precise qualifier must appear first", "", "");
        if (src.storage == EvqConst && (dst.storage == EvqIn || dst.storage == EvqOut))
            error(loc, "in/out must appear before const", "", "");
    }

    // Storage qualification
    if (dst.storage == EvqTemporary || dst.storage == EvqGlobal)
        dst.storage = src.storage;
    else if ((dst.storage == EvqIn  && src.storage == EvqOut) ||
             (dst.storage == EvqOut && src.storage == EvqIn))
        dst.storage = EvqInOut;
    else if ((dst.storage == EvqIn    && src.storage == EvqConst) ||
             (dst.storage == EvqConst && src.storage == EvqIn))
        dst.storage = EvqConstReadOnly;
    else if (src.storage != EvqTemporary &&
             src.storage != EvqGlobal)
        error(loc, "too many storage qualifiers", GetStorageQualifierString(src.storage), "");

    // Precision qualifiers
    if (! force && src.precision != EpqNone && dst.precision != EpqNone)
        error(loc, "only one precision qualifier allowed", GetPrecisionQualifierString(src.precision), "");
    if (dst.precision == EpqNone || (force && src.precision != EpqNone))
        dst.precision = src.precision;

    if (!force && ((src.coherent && (dst.devicecoherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.devicecoherent && (dst.coherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.queuefamilycoherent && (dst.coherent || dst.devicecoherent || dst.workgroupcoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.workgroupcoherent && (dst.coherent || dst.devicecoherent || dst.queuefamilycoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.subgroupcoherent  && (dst.coherent || dst.devicecoherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.shadercallcoherent)) ||
                   (src.shadercallcoherent && (dst.coherent || dst.devicecoherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.subgroupcoherent)))) {
        error(loc, "only one coherent/devicecoherent/queuefamilycoherent/workgroupcoherent/subgroupcoherent/shadercallcoherent qualifier allowed",
            GetPrecisionQualifierString(src.precision), "");
    }

    // Layout qualifiers
    mergeObjectLayoutQualifiers(dst, src, false);

    // individual qualifiers
    bool repeated = false;
    #define MERGE_SINGLETON(field) repeated |= dst.field && src.field; dst.field |= src.field;
    MERGE_SINGLETON(invariant);
    MERGE_SINGLETON(centroid);
    MERGE_SINGLETON(smooth);
    MERGE_SINGLETON(flat);
    MERGE_SINGLETON(specConstant);
    MERGE_SINGLETON(noContraction);
    MERGE_SINGLETON(nopersp);
    MERGE_SINGLETON(explicitInterp);
    MERGE_SINGLETON(perPrimitiveNV);
    MERGE_SINGLETON(perViewNV);
    MERGE_SINGLETON(perTaskNV);
    MERGE_SINGLETON(patch);
    MERGE_SINGLETON(sample);
    MERGE_SINGLETON(coherent);
    MERGE_SINGLETON(devicecoherent);
    MERGE_SINGLETON(queuefamilycoherent);
    MERGE_SINGLETON(workgroupcoherent);
    MERGE_SINGLETON(subgroupcoherent);
    MERGE_SINGLETON(shadercallcoherent);
    MERGE_SINGLETON(nonprivate);
    MERGE_SINGLETON(volatil);
    MERGE_SINGLETON(nontemporal);
    MERGE_SINGLETON(restrict);
    MERGE_SINGLETON(readonly);
    MERGE_SINGLETON(writeonly);
    MERGE_SINGLETON(nonUniform);

    // SPIR-V storage class qualifier (GL_EXT_spirv_intrinsics)
    dst.spirvStorageClass = src.spirvStorageClass;

    // SPIR-V decorate qualifiers (GL_EXT_spirv_intrinsics)
    if (src.hasSpirvDecorate()) {
        if (dst.hasSpirvDecorate()) {
            const TSpirvDecorate& srcSpirvDecorate = src.getSpirvDecorate();
            TSpirvDecorate& dstSpirvDecorate = dst.getSpirvDecorate();
            for (auto& decorate : srcSpirvDecorate.decorates) {
                if (dstSpirvDecorate.decorates.find(decorate.first) != dstSpirvDecorate.decorates.end())
                    error(loc, "too many SPIR-V decorate qualifiers", "spirv_decorate", "(decoration=%u)", decorate.first);
                else
                    dstSpirvDecorate.decorates.insert(decorate);
            }

            for (auto& decorateId : srcSpirvDecorate.decorateIds) {
                if (dstSpirvDecorate.decorateIds.find(decorateId.first) != dstSpirvDecorate.decorateIds.end())
                    error(loc, "too many SPIR-V decorate qualifiers", "spirv_decorate_id", "(decoration=%u)", decorateId.first);
                else
                    dstSpirvDecorate.decorateIds.insert(decorateId);
            }

            for (auto& decorateString : srcSpirvDecorate.decorateStrings) {
                if (dstSpirvDecorate.decorates.find(decorateString.first) != dstSpirvDecorate.decorates.end())
                    error(loc, "too many SPIR-V decorate qualifiers", "spirv_decorate_string", "(decoration=%u)", decorateString.first);
                else
                    dstSpirvDecorate.decorateStrings.insert(decorateString);
            }
        } else {
            dst.spirvDecorate = src.spirvDecorate;
        }
    }

    if (repeated)
        error(loc, "replicated qualifiers", "", "");
}